

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istring.h
# Opt level: O2

bool __thiscall wasm::IString::startsWith<6>(IString *this,char (*str) [6])

{
  bool bVar1;
  size_t sVar2;
  string_view prefix;
  
  sVar2 = strlen(*str);
  prefix._M_str = *str;
  prefix._M_len = sVar2;
  bVar1 = startsWith(this,prefix);
  return bVar1;
}

Assistant:

bool startsWith(const char (&str)[N]) {
    return startsWith(std::string_view(str));
  }